

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::ReleaseLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  RepeatedPtrFieldBase *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar3;
  MessageLite *pMVar4;
  char *description;
  Descriptor *expected;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if (0xbf < (byte)field->field_0x1) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (expected,field,"ReleaseLast",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) == 0) {
          bVar1 = FieldDescriptor::is_map(field);
          this_00 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
          if (bVar1) {
            this_00 = internal::MapFieldBase::MutableRepeatedField((MapFieldBase *)this_00);
          }
          pVVar3 = internal::RepeatedPtrFieldBase::
                   ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (this_00);
          return pVVar3;
        }
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        pMVar4 = internal::ExtensionSet::ReleaseLast
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                            field->number_);
        return (Message *)pMVar4;
      }
      description = "Field is singular; the method requires a repeated field.";
      goto LAB_0024924f;
    }
  }
  else {
    expected = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar5.descriptor,field,"ReleaseLast")
    ;
  }
  description = "Field does not match message type.";
LAB_0024924f:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"ReleaseLast",description);
}

Assistant:

Message* Reflection::ReleaseLast(Message* message,
                                 const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  Message* released;
  if (field->is_extension()) {
    released = static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      released = MutableRaw<MapFieldBase>(message, field)
                     ->MutableRepeatedField()
                     ->ReleaseLast<GenericTypeHandler<Message>>();
    } else {
      released = MutableRaw<RepeatedPtrFieldBase>(message, field)
                     ->ReleaseLast<GenericTypeHandler<Message>>();
    }
  }
  if (internal::DebugHardenForceCopyInRelease()) {
    return MaybeForceCopy(message->GetArena(), released);
  } else {
    return released;
  }
}